

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprAddChildren(Fts5ExprNode *p,Fts5ExprNode *pSub)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  int nByte;
  int ii;
  int local_1c;
  int local_14;
  
  local_14 = in_RDI[10];
  if ((*in_RDI == 3) || (*in_RSI != *in_RDI)) {
    iVar1 = in_RDI[10];
    in_RDI[10] = iVar1 + 1;
    *(int **)(in_RDI + (long)iVar1 * 2 + 0xc) = in_RSI;
  }
  else {
    memcpy(in_RDI + (long)in_RDI[10] * 2 + 0xc,in_RSI + 0xc,(long)(in_RSI[10] << 3));
    in_RDI[10] = in_RSI[10] + in_RDI[10];
    sqlite3_free((void *)0x26f12e);
  }
  for (; local_14 < in_RDI[10]; local_14 = local_14 + 1) {
    if (*(int *)(*(long *)(in_RDI + (long)local_14 * 2 + 0xc) + 0xc) + 1 < in_RDI[3]) {
      local_1c = in_RDI[3];
    }
    else {
      local_1c = *(int *)(*(long *)(in_RDI + (long)local_14 * 2 + 0xc) + 0xc) + 1;
    }
    in_RDI[3] = local_1c;
  }
  return;
}

Assistant:

static void fts5ExprAddChildren(Fts5ExprNode *p, Fts5ExprNode *pSub){
  int ii = p->nChild;
  if( p->eType!=FTS5_NOT && pSub->eType==p->eType ){
    int nByte = sizeof(Fts5ExprNode*) * pSub->nChild;
    memcpy(&p->apChild[p->nChild], pSub->apChild, nByte);
    p->nChild += pSub->nChild;
    sqlite3_free(pSub);
  }else{
    p->apChild[p->nChild++] = pSub;
  }
  for( ; ii<p->nChild; ii++){
    p->iHeight = MAX(p->iHeight, p->apChild[ii]->iHeight + 1);
  }
}